

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O1

array<unsigned_long,_4UL> * kmer_bw_neighbours(uint64_t kmer,uint8_t k)

{
  long lVar1;
  undefined7 in_register_00000011;
  array<unsigned_long,_4UL> *in_RDI;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  
  auVar2._8_4_ = (int)kmer;
  auVar2._0_8_ = kmer;
  auVar2._12_4_ = (int)(kmer >> 0x20);
  lVar3 = 0;
  lVar4 = 1;
  lVar1 = 0;
  do {
    in_RDI->_M_elems[lVar1] =
         (lVar3 << (ulong)((int)CONCAT71(in_register_00000011,k) * 2 - 2)) + (kmer >> 2);
    (in_RDI->_M_elems + lVar1)[1] = lVar4 + (auVar2._8_8_ >> 2);
    lVar1 = lVar1 + 2;
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + 2;
  } while (lVar1 != 4);
  return in_RDI;
}

Assistant:

std::array<uint64_t,4> kmer_bw_neighbours(uint64_t kmer, uint8_t k) {
    std::array<uint64_t,4> n;
    for (uint64_t i=0;i<4;++i){
        n[i]=(kmer>>2)+(((uint64_t) i)<<((k-1)*2));
    }
//    std::cout<<"Produced BW neighbours for "<<kmer_to_sequence(kmer,k)<<std::endl;
//    std::cout<<" for A: "<<kmer_to_sequence(n[0],k)<<std::endl;
//    std::cout<<" for C: "<<kmer_to_sequence(n[1],k)<<std::endl;
//    std::cout<<" for G: "<<kmer_to_sequence(n[2],k)<<std::endl;
//    std::cout<<" for T: "<<kmer_to_sequence(n[3],k)<<std::endl;
    return n;
}